

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall google::protobuf::DescriptorPool::Tables::FindSymbol(Tables *this,string_view key)

{
  SymbolsByNameSet *common;
  ctrl_t *pcVar1;
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint32_t uVar6;
  FullNameQuery *s;
  undefined1 (*pauVar7) [16];
  EqualElement<google::protobuf::(anonymous_namespace)::FullNameQuery> *f;
  size_t sVar8;
  ctrl_t *pcVar9;
  slot_type *psVar10;
  size_t *psVar11;
  Symbol SVar12;
  reference pSVar13;
  slot_type *slot;
  slot_type *slot_00;
  slot_type *slot_01;
  ulong extraout_RDX;
  Symbol *ts;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  Symbol *ts_00;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong uVar14;
  size_t *psVar15;
  ushort uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  __m128i match;
  ctrl_t cVar19;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  undefined1 auVar20 [16];
  iterator iVar36;
  const_iterator it;
  size_t hash_of_arg;
  anon_class_24_3_2b146c49 local_a8;
  anon_class_24_3_2b146c49 local_88;
  GroupPortableImpl local_70;
  FullNameQuery *local_68;
  char *local_60;
  undefined8 local_58;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  size_t local_38;
  
  local_60 = key._M_str;
  s = (FullNameQuery *)key._M_len;
  common = &this->symbols_by_name_;
  local_68 = s;
  if (1 < (this->symbols_by_name_).
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    local_38 = (anonymous_namespace)::SymbolByFullNameHash::operator()
                         ((SymbolByFullNameHash *)&local_68,s);
    local_88.hash_of_arg = &local_38;
    local_88.key = (FullNameQuery *)&local_68;
    local_88.this =
         &common->
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ;
    bVar5 = absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    );
    if (bVar5) {
      s = (FullNameQuery *)
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          ::soo_slot(&common->
                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    );
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::FullNameQuery>::
      anon_class_24_3_2b146c49::operator()(&local_88,(ctrl_t *)s,slot);
    }
    else {
      sVar8 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::capacity(&common->
                          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                        );
      if (sVar8 < 0x11) {
        psVar10 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  ::slot_array(&common->
                                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                              );
        local_a8.hash_of_arg = local_88.hash_of_arg;
        local_a8.this = local_88.this;
        local_a8.key = local_88.key;
        uVar14 = (this->symbols_by_name_).
                 super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar2 = (undefined1 (*) [16])
                  (this->symbols_by_name_).
                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control;
        if (uVar14 < 0xf) {
          if (8 < uVar14) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          local_70.ctrl = *(uint64_t *)(*pauVar2 + uVar14);
          for (local_70.ctrl =
                    (uint64_t)
                    absl::lts_20240722::container_internal::GroupPortableImpl::MaskFull(&local_70);
              local_70.ctrl != 0; local_70.ctrl = local_70.ctrl - 1 & local_70.ctrl) {
            uVar6 = absl::lts_20240722::container_internal::NonIterableBitMask<unsigned_long,_8,_3>
                    ::LowestBitSet((NonIterableBitMask<unsigned_long,_8,_3> *)&local_70);
            s = (FullNameQuery *)(psVar10 + ((ulong)uVar6 - 1));
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::FullNameQuery>::
            anon_class_24_3_2b146c49::operator()(&local_a8,(ctrl_t *)s,slot_00);
          }
        }
        else {
          local_48._0_8_ = this;
          uVar14 = (this->symbols_by_name_).
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value.size_ >> 1;
          local_58 = uVar14;
          while (pauVar7 = pauVar2, uVar14 != 0) {
            auVar18 = *pauVar7;
            for (uVar16 = ~((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar18[0xf] >> 7) << 0xf); uVar16 != 0;
                uVar16 = uVar16 - 1 & uVar16) {
              uVar6 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar16);
              if ((char)(*pauVar7)[uVar6] < '\0') {
                __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x764,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
              s = (FullNameQuery *)(psVar10 + uVar6);
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::FullNameQuery>::
              anon_class_24_3_2b146c49::operator()(&local_a8,(ctrl_t *)s,slot_01);
              uVar14 = uVar14 - 1;
            }
            psVar10 = psVar10 + 0x10;
            pauVar2 = pauVar7 + 1;
            if ((uVar14 != 0) && ((*pauVar7)[0xf] == -1)) {
              __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x76b,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
          }
          this = (Tables *)local_48._0_8_;
          if (local_58 <
              (((SymbolsByNameSet *)(local_48._0_8_ + 200))->
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ).settings_.
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value
              .size_ >> 1) {
            __assert_fail("original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x770,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
        }
      }
    }
  }
  bVar5 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          ::is_soo(&common->
                    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  );
  if (bVar5) {
    bVar5 = absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    );
    if (!bVar5) {
      __assert_fail("is_soo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xda7,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::FullNameQuery]"
                   );
    }
    uVar14 = extraout_RDX;
    if (1 < (this->symbols_by_name_).
            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            size_) {
      local_a8.this =
           &common->
            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ;
      local_a8.key = (FullNameQuery *)&local_68;
      f = (EqualElement<google::protobuf::(anonymous_namespace)::FullNameQuery> *)
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          ::soo_slot(&common->
                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    );
      bVar5 = absl::lts_20240722::container_internal::
              hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
              ::
              apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::(anonymous_namespace)::FullNameQuery>,google::protobuf::Symbol&,absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                        ((hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                          *)&local_a8,f,ts);
      uVar14 = extraout_RDX_00;
      if (bVar5) {
        iVar36 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 ::soo_iterator(&common->
                                 super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                               );
        goto LAB_001dd895;
      }
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar14;
    iVar36 = (iterator)(auVar3 << 0x40);
  }
  else {
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ::prefetch_heap_block
              (&common->
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              );
    sVar8 = (anonymous_namespace)::SymbolByFullNameHash::operator()
                      ((SymbolByFullNameHash *)&local_68,s);
    bVar5 = absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    );
    if (bVar5) {
      __assert_fail("!is_soo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdb0,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::FullNameQuery]"
                   );
    }
    absl::lts_20240722::container_internal::probe
              ((probe_seq<16UL> *)&local_a8,(CommonFields *)common,sVar8);
    pcVar9 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ::control(&common->
                        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                      );
    auVar18 = ZEXT416((CONCAT11((char)sVar8,(char)sVar8) & 0xff7f) & 0xffff7fff);
    auVar18 = pshuflw(auVar18,auVar18,0);
    uVar17 = auVar18._0_4_;
    local_48._4_4_ = uVar17;
    local_48._0_4_ = uVar17;
    local_48._8_4_ = uVar17;
    local_48._12_4_ = uVar17;
    uVar14 = extraout_RDX_01;
    while( true ) {
      pcVar1 = pcVar9 + (long)local_a8.this;
      auVar18[0] = -(local_48[0] == *pcVar1);
      auVar18[1] = -(local_48[1] == pcVar1[1]);
      auVar18[2] = -(local_48[2] == pcVar1[2]);
      auVar18[3] = -(local_48[3] == pcVar1[3]);
      auVar18[4] = -(local_48[4] == pcVar1[4]);
      auVar18[5] = -(local_48[5] == pcVar1[5]);
      auVar18[6] = -(local_48[6] == pcVar1[6]);
      auVar18[7] = -(local_48[7] == pcVar1[7]);
      auVar18[8] = -(local_48[8] == pcVar1[8]);
      auVar18[9] = -(local_48[9] == pcVar1[9]);
      auVar18[10] = -(local_48[10] == pcVar1[10]);
      auVar18[0xb] = -(local_48[0xb] == pcVar1[0xb]);
      auVar18[0xc] = -(local_48[0xc] == pcVar1[0xc]);
      auVar18[0xd] = -(local_48[0xd] == pcVar1[0xd]);
      auVar18[0xe] = -(local_48[0xe] == pcVar1[0xe]);
      auVar18[0xf] = -(local_48[0xf] == pcVar1[0xf]);
      cVar19 = *pcVar1;
      cVar21 = pcVar1[1];
      cVar22 = pcVar1[2];
      cVar23 = pcVar1[3];
      cVar24 = pcVar1[4];
      cVar25 = pcVar1[5];
      cVar26 = pcVar1[6];
      cVar27 = pcVar1[7];
      cVar28 = pcVar1[8];
      cVar29 = pcVar1[9];
      cVar30 = pcVar1[10];
      cVar31 = pcVar1[0xb];
      cVar32 = pcVar1[0xc];
      cVar33 = pcVar1[0xd];
      cVar34 = pcVar1[0xe];
      cVar35 = pcVar1[0xf];
      for (uVar16 = (ushort)(SUB161(auVar18 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar18[0xf] >> 7) << 0xf; auVar4._8_8_ = 0, auVar4._0_8_ = uVar14,
          iVar36 = (iterator)(auVar4 << 0x40), uVar16 != 0; uVar16 = uVar16 - 1 & uVar16) {
        local_58 = CONCAT17(cVar27,CONCAT16(cVar26,CONCAT15(cVar25,CONCAT14(cVar24,CONCAT13(cVar23,
                                                  CONCAT12(cVar22,CONCAT11(cVar21,cVar19)))))));
        cStack_50 = cVar28;
        cStack_4f = cVar29;
        cStack_4e = cVar30;
        cStack_4d = cVar31;
        cStack_4c = cVar32;
        cStack_4b = cVar33;
        cStack_4a = cVar34;
        cStack_49 = cVar35;
        uVar6 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar16);
        local_88.key = (FullNameQuery *)&local_68;
        local_88.this =
             &common->
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
        ;
        psVar10 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  ::slot_array(&common->
                                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                              );
        bVar5 = absl::lts_20240722::container_internal::
                hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                ::
                apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::(anonymous_namespace)::FullNameQuery>,google::protobuf::Symbol&,absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                          ((hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                            *)&local_88,
                           (EqualElement<google::protobuf::(anonymous_namespace)::FullNameQuery> *)
                           (psVar10 +
                           ((long)&((local_a8.this)->settings_).
                                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                   .
                                   super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                   .value.capacity_ + (ulong)uVar6 & (ulong)local_a8.key)),ts_00);
        if (bVar5) {
          iVar36 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   ::iterator_at(&common->
                                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                 ,(long)&((local_a8.this)->settings_).
                                         super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                         .
                                         super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                         .value.capacity_ + (ulong)uVar6 & (ulong)local_a8.key);
          goto LAB_001dd895;
        }
        uVar14 = extraout_RDX_02;
        cVar19 = (ctrl_t)local_58;
        cVar21 = local_58._1_1_;
        cVar22 = local_58._2_1_;
        cVar23 = local_58._3_1_;
        cVar24 = local_58._4_1_;
        cVar25 = local_58._5_1_;
        cVar26 = local_58._6_1_;
        cVar27 = local_58._7_1_;
        cVar28 = cStack_50;
        cVar29 = cStack_4f;
        cVar30 = cStack_4e;
        cVar31 = cStack_4d;
        cVar32 = cStack_4c;
        cVar33 = cStack_4b;
        cVar34 = cStack_4a;
        cVar35 = cStack_49;
      }
      auVar20[0] = -(cVar19 == kEmpty);
      auVar20[1] = -(cVar21 == kEmpty);
      auVar20[2] = -(cVar22 == kEmpty);
      auVar20[3] = -(cVar23 == kEmpty);
      auVar20[4] = -(cVar24 == kEmpty);
      auVar20[5] = -(cVar25 == kEmpty);
      auVar20[6] = -(cVar26 == kEmpty);
      auVar20[7] = -(cVar27 == kEmpty);
      auVar20[8] = -(cVar28 == kEmpty);
      auVar20[9] = -(cVar29 == kEmpty);
      auVar20[10] = -(cVar30 == kEmpty);
      auVar20[0xb] = -(cVar31 == kEmpty);
      auVar20[0xc] = -(cVar32 == kEmpty);
      auVar20[0xd] = -(cVar33 == kEmpty);
      auVar20[0xe] = -(cVar34 == kEmpty);
      auVar20[0xf] = -(cVar35 == kEmpty);
      if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar20 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar20 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar20 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar20 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar20 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar35 == kEmpty)
      break;
      psVar15 = local_a8.hash_of_arg + 2;
      local_a8.this =
           (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            *)((long)&((local_a8.this)->settings_).
                      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                      .value.capacity_ + (long)psVar15 & (ulong)local_a8.key);
      local_a8.hash_of_arg = psVar15;
      psVar11 = (size_t *)
                absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                ::capacity(&common->
                            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                          );
      uVar14 = extraout_RDX_03;
      if (psVar11 < psVar15) {
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xdbd,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::FullNameQuery]"
                     );
      }
    }
  }
LAB_001dd895:
  local_88.key = (FullNameQuery *)0x0;
  local_a8._0_16_ = iVar36;
  bVar5 = absl::lts_20240722::container_internal::operator==
                    ((iterator *)&local_a8,(iterator *)&local_88);
  if (bVar5) {
    SVar12.ptr_ = (SymbolBase *)&Symbol::Symbol()::null_symbol;
  }
  else {
    pSVar13 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::iterator::operator*((iterator *)&local_a8);
    SVar12.ptr_ = pSVar13->ptr_;
  }
  return (Symbol)SVar12.ptr_;
}

Assistant:

inline Symbol DescriptorPool::Tables::FindSymbol(absl::string_view key) const {
  auto it = symbols_by_name_.find(FullNameQuery{key});
  return it == symbols_by_name_.end() ? Symbol() : *it;
}